

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_playlist.cpp
# Opt level: O2

void __thiscall
CP::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::reorder
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int pos,vector<int,_std::allocator<int>_> *selected)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  iterator it;
  int *piVar4;
  iterator it_00;
  
  it_00.ptr = this->mHeader;
  iVar2 = 0;
  if (0 < pos) {
    iVar2 = pos;
  }
  iVar2 = iVar2 + 1;
  do {
    it_00.ptr = (it_00.ptr)->next;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  piVar1 = (selected->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  iVar2 = 0;
  for (piVar4 = (selected->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
    it.ptr = this->mHeader;
    iVar3 = 0;
    if (*piVar4 < pos) {
      iVar3 = iVar2;
    }
    iVar3 = *piVar4 - iVar3;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    iVar3 = iVar3 + 1;
    do {
      it.ptr = (it.ptr)->next;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    insert(this,it_00,&(it.ptr)->data);
    erase(this,it);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void reorder(int pos,std::vector<int> selected) {
      //write your code only here
      iterator insert_pos = begin();
      for (int i = 0; i < pos; ++i) {
        ++insert_pos;
      }
      int shift = 0;
      for (auto p : selected) {
        iterator it = begin();
        if (p < pos) p -= shift;
        for (int i = 0; i < p; ++i) {
          ++it;
        }
        insert(insert_pos, *it);
        erase(it);
        ++shift;
      }
    }